

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

bool __thiscall CDirectiveIncbin::Validate(CDirectiveIncbin *this,ValidateState *state)

{
  bool bVar1;
  int64_t iVar2;
  long lVar3;
  Architecture *pAVar4;
  long lVar5;
  long lVar6;
  char *text;
  
  iVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar2;
  if ((this->startExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this->start = 0;
    lVar3 = 0;
LAB_00170ea0:
    if ((this->sizeExpression).expression.
        super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      lVar5 = this->fileSize;
      lVar6 = lVar5 - lVar3;
      this->size = lVar6;
    }
    else {
      bVar1 = Expression::evaluateInteger<long>(&this->sizeExpression,&this->size);
      if (!bVar1) {
        text = "Invalid size expression";
        goto LAB_00170f22;
      }
      lVar3 = this->start;
      lVar5 = this->fileSize;
      lVar6 = this->size;
    }
    if (lVar5 < lVar6 + lVar3) {
      Logger::queueError<>(Warning,"Read size truncated due to file size");
      this->size = this->fileSize - this->start;
    }
    pAVar4 = Architecture::current();
    (*pAVar4->_vptr_Architecture[3])(pAVar4);
    FileManager::advanceMemory(g_fileManager,this->size);
  }
  else {
    bVar1 = Expression::evaluateInteger<long>(&this->startExpression,&this->start);
    if (bVar1) {
      lVar3 = this->start;
      if (lVar3 <= this->fileSize) goto LAB_00170ea0;
      text = "Start position past end of file";
    }
    else {
      text = "Invalid position expression";
    }
LAB_00170f22:
    Logger::queueError<>(Error,text);
  }
  return false;
}

Assistant:

bool CDirectiveIncbin::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (startExpression.isLoaded())
	{
		if (!startExpression.evaluateInteger(start))
		{
			Logger::queueError(Logger::Error, "Invalid position expression");
			return false;
		}

		if (start > fileSize)
		{
			Logger::queueError(Logger::Error, "Start position past end of file");
			return false;
		}
	} else {
		start = 0;
	}

	if (sizeExpression.isLoaded())
	{
		if (!sizeExpression.evaluateInteger(size))
		{
			Logger::queueError(Logger::Error, "Invalid size expression");
			return false;
		}
	} else {
		size = fileSize-start;
	}

	if (start+size > fileSize)
	{
		Logger::queueError(Logger::Warning, "Read size truncated due to file size");
		size = fileSize-start;
	}

	Architecture::current().NextSection();
	g_fileManager->advanceMemory(size);
	return false;
}